

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

void __thiscall
persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::
sort_columns(persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
             *this)

{
  ostream *poVar1;
  size_type sVar2;
  _Deque_iterator<filtration_index_t,_filtration_index_t_&,_filtration_index_t_*> *in_RDI;
  greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_computer::directed_flag_complex_computer_t_&>
  unaff_retaddr;
  deque<filtration_index_t,_std::allocator<filtration_index_t>_> *in_stack_ffffffffffffff98;
  greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_computer::directed_flag_complex_computer_t_&>
  local_50 [8];
  _Deque_iterator<filtration_index_t,_filtration_index_t_&,_filtration_index_t_*>
  *in_stack_fffffffffffffff0;
  _Deque_iterator<filtration_index_t,_filtration_index_t_&,_filtration_index_t_*> *__first;
  
  __first = in_RDI;
  poVar1 = std::operator<<((ostream *)&std::cout,"\x1b[K");
  poVar1 = std::operator<<(poVar1,"sorting ");
  sVar2 = std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::size
                    ((deque<filtration_index_t,_std::allocator<filtration_index_t>_> *)0x1ede98);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  poVar1 = std::operator<<(poVar1," columns");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  std::operator<<(poVar1,"\r");
  std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::begin
            (in_stack_ffffffffffffff98);
  std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::end
            (in_stack_ffffffffffffff98);
  greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_computer::directed_flag_complex_computer_t_&>
  ::greater_filtration_or_better_pivot_or_smaller_index
            (local_50,(directed_flag_complex_computer_t *)in_RDI->_M_cur);
  std::
  sort<std::_Deque_iterator<filtration_index_t,filtration_index_t&,filtration_index_t*>,greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,directed_flag_complex_computer::directed_flag_complex_computer_t&>>
            (__first,in_stack_fffffffffffffff0,unaff_retaddr);
  std::operator<<((ostream *)&std::cout,"\x1b[K");
  return;
}

Assistant:

void sort_columns() {
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "sorting " << columns_to_reduce.size() << " columns" << std::flush << "\r";
#endif

#ifdef SORT_COLUMNS_BY_PIVOT
		std_algorithms::sort(
		    columns_to_reduce.begin(), columns_to_reduce.end(),
		    greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t, decltype(complex)>(complex));
#else
		std_algorithms::sort(columns_to_reduce.begin(), columns_to_reduce.end(),
		                     greater_filtration_or_smaller_index<filtration_index_t>());
#endif
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K";
#endif
	}